

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_DEFB(Context *ctx)

{
  char local_58 [8];
  char dst [64];
  Context *ctx_local;
  
  get_ARB1_destarg_varname(ctx,local_58,0x40);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s = %d;",local_58,(ulong)(ctx->dwords[0] != 0));
  pop_output(ctx);
  return;
}

Assistant:

static void emit_ARB1_DEFB(Context *ctx)
{
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s = %d;", dst, ctx->dwords[0] ? 1 : 0);
    pop_output(ctx);
}